

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O0

void LoadBookHashTable(void)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string side;
  string move_s;
  char *temp;
  string line;
  int buff_p;
  char *buff;
  string *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__dest;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  string local_30 [36];
  undefined4 local_c;
  void *local_8;
  
  BookHashTable = (BookHashNode *)operator_new__(0x1800000);
  memset(BookHashTable,0,0x1800000);
  local_8 = operator_new__(0x1000000);
  memset(local_8,0,0x1000000);
  local_c = 0;
  decompress(in_stack_fffffffffffffee0);
  std::__cxx11::string::string(local_30);
  while( true ) {
    bVar1 = getLine((char *)in_stack_fffffffffffffec8,(int *)in_stack_fffffffffffffec0,
                    in_stack_fffffffffffffeb8);
    if (!bVar1) break;
    InitBookZobrist();
    lVar2 = std::__cxx11::string::size();
    __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          operator_new__(lVar2 + 1);
    __dest = __s;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    strcpy((char *)__dest,pcVar3);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            strtok((char *)__s,":");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff98,(char *)__lhs,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    pcVar3 = strtok((char *)0x0,anon_var_dwarf_125dc + 0x25);
    std::__cxx11::string::operator=(local_30,pcVar3);
    pcVar3 = strtok((char *)0x0,anon_var_dwarf_125dc + 0x25);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar3,&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::operator+(__lhs,(char *)__dest);
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    std::__cxx11::string::operator=(local_30,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    in_stack_fffffffffffffec8 = __s;
    if (__s != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(__s);
      in_stack_fffffffffffffec8 = __s;
    }
    in_stack_fffffffffffffec0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::c_str();
    std::__cxx11::string::string(local_f8,(string *)&stack0xffffffffffffff98);
    FENToHash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  if (local_8 != (void *)0x0) {
    operator_delete__(local_8);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void LoadBookHashTable(){
    BookHashTable = new BookHashNode[BOOK_HASHTABLE_SIZE];
    memset(BookHashTable, 0, BOOK_HASHTABLE_SIZE * sizeof(BookHashNode));

    char* buff = new char[1<<24];
    memset(buff, 0, (1<<24) * sizeof(char));
    int buff_p = 0;
    decompress(buff);

    string line;
    while(getLine(buff, buff_p, line)){
        InitBookZobrist();
        char* temp = new char[line.size() + 1];
		strcpy(temp, line.c_str());
        string move_s = strtok(temp, ":");

		line = strtok(NULL, " ");
		string side = strtok(NULL, " ");
		line = line + " " + side;       // line存放FEN串
        delete temp;
        FENToHash(line.c_str(), move_s);                 // 将对应局面存入哈希表
    }
    delete[] buff;
}